

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error
adios2_set_memory_selection
          (adios2_variable *variable,size_t ndims,size_t *memory_start,size_t *memory_count)

{
  Dims memoryStartV;
  Dims memoryCountV;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for adios2_variable, in call to adios2_set_memory_selection",
             (allocator *)&local_e0);
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string
            ((string *)&local_60,"for start, in call to adios2_set_memory_selection",
             (allocator *)&local_e0);
  adios2::helper::CheckForNullptr<unsigned_long_const>(memory_start,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string
            ((string *)&local_80,"for count, in call to adios2_set_memory_selection",
             (allocator *)&local_e0);
  adios2::helper::CheckForNullptr<unsigned_long_const>(memory_count,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0,memory_start,
             memory_start + ndims,(allocator_type *)&local_e0);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,memory_count,
             memory_count + ndims,(allocator_type *)&local_e0);
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (&local_e0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98);
  adios2::core::VariableBase::SetMemorySelection((pair *)variable);
  std::
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::~pair(&local_e0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_b0);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_memory_selection(adios2_variable *variable, const size_t ndims,
                                         const size_t *memory_start, const size_t *memory_count)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_memory_selection");
        adios2::helper::CheckForNullptr(memory_start, "for start, in call to "
                                                      "adios2_set_memory_selection");
        adios2::helper::CheckForNullptr(memory_count, "for count, in call to "
                                                      "adios2_set_memory_selection");
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::Dims memoryStartV(memory_start, memory_start + ndims);
        const adios2::Dims memoryCountV(memory_count, memory_count + ndims);
        variableBase->SetMemorySelection({memoryStartV, memoryCountV});
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_memory_selection"));
    }
}